

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O1

bool bhf::ads::PrependUdpTag(Frame *frame,string *value,uint16_t tagId)

{
  ulong uVar1;
  uint uVar2;
  ostream *poVar3;
  stringstream stream;
  string local_1d0;
  uint16_t local_1b0 [8];
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  uVar1 = value->_M_string_length + 1;
  if (uVar1 < 0x10000) {
    uVar2 = (int)value->_M_string_length + 1;
    Frame::prepend(frame,(value->_M_dataplus)._M_p,(ulong)(uVar2 & 0xffff));
    local_1b0[0] = (uint16_t)uVar2;
    Frame::prepend(frame,local_1b0,2);
    local_1b0[0] = tagId;
    Frame::prepend(frame,local_1b0,2);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"PrependUdpTag",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"(): value is too long, skipping tagId (",0x27);
    *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 2;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    std::__cxx11::stringbuf::str();
    Logger::Log(2,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base(local_130);
  }
  return uVar1 < 0x10000;
}

Assistant:

static bool PrependUdpTag(Frame& frame, const std::string& value, const uint16_t tagId)
{
    if (value.length() + 1 > std::numeric_limits<uint16_t>::max()) {
        LOG_WARN(__FUNCTION__ << "(): value is too long, skipping tagId (" << std::dec << tagId << ")\n");
        return false;
    }
    const auto length = static_cast<uint16_t>(value.length() + 1);
    frame.prepend(value.data(), length);
    return PrependUdpLenTagId(frame, length, tagId);
}